

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn.h
# Opt level: O0

uint __thiscall asn1::MemBuffer::read<unsigned_int>(MemBuffer *this)

{
  reference pvVar1;
  uint local_24;
  uint i;
  uint8_t *p;
  MemBuffer *pMStack_10;
  uint t;
  MemBuffer *this_local;
  
  pMStack_10 = this;
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->data,(this->readpos + 3) - (ulong)local_24);
    *(value_type *)((long)&p + (ulong)local_24 + 4) = *pvVar1;
  }
  this->readpos = this->readpos + 4;
  return p._4_4_;
}

Assistant:

T read()
    {
        T t;
        uint8_t* p = (uint8_t*)&t;
        for (unsigned i = 0; i < sizeof(T); i++)
            p[i] = data[readpos + sizeof(T) - 1 - i];
        readpos += sizeof(T);
        return t;
    }